

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  char cVar1;
  ushort uVar2;
  byte bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  String local_38;
  
  switch(other) {
  case nullValue:
    if (*(byte *)&this->bits_ - 1 < 3) {
      dVar5 = asDouble(this);
      if ((dVar5 != 0.0) || (NAN(dVar5))) goto LAB_00132e1e;
LAB_00132f35:
      bVar3 = true;
      bVar4 = false;
    }
    else {
LAB_00132e1e:
      if ((*(char *)&this->bits_ == '\x05') && ((this->value_).bool_ != true)) goto LAB_00132f35;
      bVar4 = *(char *)&this->bits_ == '\x04';
      if ((bVar4) && (asString_abi_cxx11_(&local_38,this), local_38._M_string_length == 0)) {
        bVar4 = true;
LAB_00132f3e:
        bVar3 = true;
      }
      else {
        cVar1 = (char)*(ushort *)&this->bits_;
        uVar2 = *(ushort *)&this->bits_ & 0xff;
        if (cVar1 == '\a') {
LAB_00132e7b:
          if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)
          goto LAB_00132f3e;
        }
        else if (cVar1 == '\x06') {
          if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)
          goto LAB_00132f3e;
          if (uVar2 == 7) goto LAB_00132e7b;
        }
        bVar3 = uVar2 == 0;
      }
    }
    if ((bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2)) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    break;
  case intValue:
    bVar4 = isInt(this);
    bVar3 = 1;
    if (bVar4) break;
    cVar1 = (char)*(ushort *)&this->bits_;
    if (cVar1 == '\x05') break;
    if (cVar1 == '\x03') {
      if ((*(ushort *)&this->bits_ & 0xff) == 5) break;
      dVar5 = (this->value_).real_;
      dVar6 = 2147483647.0;
      dVar7 = -2147483648.0;
LAB_00132ed2:
      bVar3 = 1;
      if (dVar5 <= dVar6 && dVar7 <= dVar5) break;
    }
    goto LAB_00132ee9;
  case uintValue:
    bVar4 = isUInt(this);
    bVar3 = 1;
    if (bVar4) break;
    cVar1 = (char)*(ushort *)&this->bits_;
    if (cVar1 == '\x05') break;
    if (cVar1 == '\x03') {
      if ((*(ushort *)&this->bits_ & 0xff) == 5) break;
      dVar5 = (this->value_).real_;
      dVar6 = 4294967295.0;
      dVar7 = 0.0;
      goto LAB_00132ed2;
    }
LAB_00132ee9:
    bVar3 = cVar1 == '\0';
    break;
  case realValue:
  case booleanValue:
    bVar3 = (byte)*(undefined2 *)&this->bits_;
    if (bVar3 < 6) {
      bVar3 = 0x2f >> (bVar3 & 0x1f);
    }
    else {
      bVar3 = 0;
    }
    break;
  case stringValue:
    bVar3 = (*(ushort *)&this->bits_ & 0xfe) < 6;
    break;
  case arrayValue:
    cVar1 = *(char *)&this->bits_;
    bVar4 = cVar1 == '\x06';
    goto LAB_00132f1c;
  case objectValue:
    cVar1 = *(char *)&this->bits_;
    bVar4 = cVar1 == '\a';
LAB_00132f1c:
    bVar3 = cVar1 == '\0' | bVar4;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK/src/external/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x356,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type() == booleanValue && !value_.bool_) ||
           (type() == stringValue && asString().empty()) ||
           (type() == arrayValue && value_.map_->empty()) ||
           (type() == objectValue && value_.map_->empty()) ||
           type() == nullValue;
  case intValue:
    return isInt() ||
           (type() == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type() == booleanValue || type() == nullValue;
  case uintValue:
    return isUInt() ||
           (type() == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type() == booleanValue || type() == nullValue;
  case realValue:
    return isNumeric() || type() == booleanValue || type() == nullValue;
  case booleanValue:
    return isNumeric() || type() == booleanValue || type() == nullValue;
  case stringValue:
    return isNumeric() || type() == booleanValue || type() == stringValue ||
           type() == nullValue;
  case arrayValue:
    return type() == arrayValue || type() == nullValue;
  case objectValue:
    return type() == objectValue || type() == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}